

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O2

LabelInstr * __thiscall
FlowGraph::DeleteLeaveChainBlocks(FlowGraph *this,BranchInstr *leaveInstr,Instr **instrPrev)

{
  IRKind IVar1;
  OpCode OVar2;
  code *pcVar3;
  bool bVar4;
  Instr *pIVar5;
  undefined4 *puVar6;
  BranchInstr *this_00;
  LabelInstr *pLVar7;
  LabelInstr *pLVar8;
  LabelInstr *this_01;
  
  pLVar8 = leaveInstr->m_branchTarget;
  pIVar5 = IR::Instr::GetNextBranchOrLabel(&pLVar8->super_Instr);
  if (pIVar5->m_kind == InstrKindBranch) {
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  }
  else {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                       ,0x19,"(leaveTarget->GetNextBranchOrLabel()->IsBranchInstr())",
                       "leaveTarget->GetNextBranchOrLabel()->IsBranchInstr()");
    if (!bVar4) goto LAB_003f4fa5;
    *puVar6 = 0;
  }
  pIVar5 = IR::Instr::GetNextBranchOrLabel(&pLVar8->super_Instr);
  this_00 = IR::Instr::AsBranchInstr(pIVar5);
  while( true ) {
    pLVar7 = IR::Instr::AsLabelInstr(&pLVar8->super_Instr);
    OVar2 = (this_00->super_Instr).m_opcode;
    if ((OVar2 != Leave) && (OVar2 != BrOnException)) {
      if (OVar2 == Br) {
        *instrPrev = (this_00->super_Instr).m_next;
        pLVar8 = this_00->m_branchTarget;
        RemoveBlock(this,pLVar7->m_block,(GlobOpt *)0x0,false);
        return pLVar8;
      }
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar6 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                         ,0x1f,
                         "(leaveChain->m_opcode == Js::OpCode::Leave || leaveChain->m_opcode == Js::OpCode::BrOnException)"
                         ,
                         "leaveChain->m_opcode == Js::OpCode::Leave || leaveChain->m_opcode == Js::OpCode::BrOnException"
                        );
      if (!bVar4) goto LAB_003f4fa5;
      *puVar6 = 0;
    }
    pLVar8 = (LabelInstr *)IR::Instr::GetNextRealInstrOrLabel(&this_00->super_Instr);
    pIVar5 = IR::Instr::GetNextRealInstrOrLabel((Instr *)pLVar8);
    IVar1 = pIVar5->m_kind;
    pIVar5 = IR::Instr::GetNextRealInstrOrLabel((Instr *)pLVar8);
    if (IVar1 != InstrKindBranch) break;
LAB_003f4f4e:
    this_00 = IR::Instr::AsBranchInstr(pIVar5);
    RemoveBlock(this,pLVar7->m_block,(GlobOpt *)0x0,false);
  }
  this_01 = pLVar8;
  if (pIVar5->m_opcode == ProfiledLoopEnd) goto LAB_003f4ee8;
  AssertCount = AssertCount + 1;
  Js::Throw::LogAssert();
  *puVar6 = 1;
  bVar4 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                     ,0x24,
                     "(nextLabel->GetNextRealInstrOrLabel()->m_opcode == Js::OpCode::ProfiledLoopEnd)"
                     ,
                     "nextLabel->GetNextRealInstrOrLabel()->m_opcode == Js::OpCode::ProfiledLoopEnd"
                    );
  while (bVar4 != false) {
    *puVar6 = 0;
LAB_003f4ee8:
    do {
      this_01 = (LabelInstr *)IR::Instr::GetNextRealInstrOrLabel(&this_01->super_Instr);
      pIVar5 = IR::Instr::GetNextRealInstrOrLabel((Instr *)this_01);
      if (pIVar5->m_kind == InstrKindBranch) {
        pIVar5 = IR::Instr::GetNextRealInstrOrLabel((Instr *)this_01);
        goto LAB_003f4f4e;
      }
    } while ((this_01->super_Instr).m_opcode == ProfiledLoopEnd);
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                       ,0x28,"(loopEnd->m_opcode == Js::OpCode::ProfiledLoopEnd)",
                       "loopEnd->m_opcode == Js::OpCode::ProfiledLoopEnd");
  }
LAB_003f4fa5:
  pcVar3 = (code *)invalidInstructionException();
  (*pcVar3)();
}

Assistant:

IR::LabelInstr * FlowGraph::DeleteLeaveChainBlocks(IR::BranchInstr *leaveInstr, IR::Instr * &instrPrev)
{
    // Cleanup Rest of the Leave chain
    IR::LabelInstr * leaveTarget = leaveInstr->GetTarget();
    Assert(leaveTarget->GetNextBranchOrLabel()->IsBranchInstr());
    IR::BranchInstr *leaveChain = leaveTarget->GetNextBranchOrLabel()->AsBranchInstr();
    IR::LabelInstr * curLabel = leaveTarget->AsLabelInstr();

    while (leaveChain->m_opcode != Js::OpCode::Br)
    {
        Assert(leaveChain->m_opcode == Js::OpCode::Leave || leaveChain->m_opcode == Js::OpCode::BrOnException);
        IR::Instr * nextLabel = leaveChain->GetNextRealInstrOrLabel();
        if (!nextLabel->GetNextRealInstrOrLabel()->IsBranchInstr())
        {
            // For jit loop bodies - we can encounter ProfiledLoopEnd before every early return
            Assert(nextLabel->GetNextRealInstrOrLabel()->m_opcode == Js::OpCode::ProfiledLoopEnd);
            IR::Instr * loopEnd = nextLabel->GetNextRealInstrOrLabel();
            while (!loopEnd->GetNextRealInstrOrLabel()->IsBranchInstr())
            {
                Assert(loopEnd->m_opcode == Js::OpCode::ProfiledLoopEnd);
                loopEnd = loopEnd->GetNextRealInstrOrLabel();
            }
            leaveChain = loopEnd->GetNextRealInstrOrLabel()->AsBranchInstr();
        }
        else
        {
            leaveChain = nextLabel->GetNextRealInstrOrLabel()->AsBranchInstr();
        }
        BasicBlock *curBlock = curLabel->GetBasicBlock();
        this->RemoveBlock(curBlock);
        curLabel = nextLabel->AsLabelInstr();
    }

    instrPrev = leaveChain->m_next;
    IR::LabelInstr * exitLabel = leaveChain->GetTarget();
    BasicBlock * curBlock = curLabel->GetBasicBlock();
    this->RemoveBlock(curBlock);
    return exitLabel;
}